

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O1

NBestEncodeResult * __thiscall
sentencepiece::unigram::Model::NBestEncode
          (NBestEncodeResult *__return_storage_ptr__,Model *this,string_view normalized,
          int nbest_size)

{
  char *pcVar1;
  uint uVar2;
  size_t nbest_size_00;
  char *pcVar3;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *__range3;
  Rep *pRVar4;
  initializer_list<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  __l;
  initializer_list<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  __l_00;
  EncodeResult results;
  Lattice lattice;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  local_108;
  void *local_e8;
  undefined8 uStack_e0;
  long local_d8;
  undefined1 local_c8 [152];
  
  (*(this->super_ModelInterface)._vptr_ModelInterface[2])(local_c8);
  if ((__uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
       )local_c8._0_8_ ==
      (__uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
       )0x0) {
    util::Status::~Status((Status *)local_c8);
    if (normalized._M_len != 0) {
      uVar2 = 0x400;
      if (nbest_size < 0x400) {
        uVar2 = nbest_size;
      }
      nbest_size_00 = 1;
      if (1 < (int)uVar2) {
        nbest_size_00 = (size_t)uVar2;
      }
      if (1 < nbest_size) {
        Lattice::Lattice((Lattice *)local_c8);
        Lattice::SetSentence((Lattice *)local_c8,normalized);
        PopulateNodes(this,(Lattice *)local_c8);
        (__return_storage_ptr__->
        super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Lattice::NBest((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                        *)&local_108,(Lattice *)local_c8,nbest_size_00,false,0.0);
        if (local_108.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_108.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pRVar4 = (Rep *)local_108.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_e8 = (void *)0x0;
            uStack_e0 = 0;
            local_d8 = 0;
            pcVar1 = (pRVar4->error_message)._M_dataplus._M_p;
            for (pcVar3 = *(char **)pRVar4; pcVar3 != pcVar1; pcVar3 = pcVar3 + 8) {
              std::
              vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
              ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int_const&>
                        ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
                          *)&local_e8,*(basic_string_view<char,_std::char_traits<char>_> **)pcVar3,
                         (int *)((long)&(*(basic_string_view<char,_std::char_traits<char>_> **)
                                          pcVar3)[1]._M_str + 4));
            }
            std::
            vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
            ::
            emplace_back<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>&,float_const&>
                      ((vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
                        *)__return_storage_ptr__,
                       (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                        *)&local_e8,(float *)&(pRVar4->error_message).field_2);
            if (local_e8 != (void *)0x0) {
              operator_delete(local_e8,local_d8 - (long)local_e8);
            }
            pRVar4 = (Rep *)((pRVar4->error_message).field_2._M_local_buf + 8);
          } while (pRVar4 != (Rep *)local_108.
                                    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::
        vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
        ::~vector((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                   *)&local_108);
        Lattice::~Lattice((Lattice *)local_c8);
        return __return_storage_ptr__;
      }
      (*(this->super_ModelInterface)._vptr_ModelInterface[5])
                (&local_108,this,normalized._M_len,normalized._M_str);
      local_c8._0_8_ =
           local_108.
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c8._8_8_ =
           local_108.
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c8._16_8_ =
           local_108.
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_108.
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8._24_4_ = 0.0;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_c8;
      std::
      vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
      ::vector(__return_storage_ptr__,__l_00,(allocator_type *)&local_e8);
      goto LAB_001f7ca2;
    }
  }
  else {
    util::Status::~Status((Status *)local_c8);
  }
  local_108.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            *)local_c8,&local_108);
  local_c8._24_4_ = 0.0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_c8;
  std::
  vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ::vector(__return_storage_ptr__,__l,(allocator_type *)&local_e8);
LAB_001f7ca2:
  if ((Rep *)local_c8._0_8_ != (Rep *)0x0) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
  }
  if (local_108.
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

NBestEncodeResult Model::NBestEncode(absl::string_view normalized,
                                     int nbest_size) const {
  if (!status().ok() || normalized.empty()) {
    return {{{}, 0.0}};
  }

  nbest_size = std::max<int>(1, std::min<int>(nbest_size, 1024));

  if (nbest_size <= 1) {
    return {std::pair<EncodeResult, float>(Encode(normalized), 0.0)};
  }

  Lattice lattice;
  lattice.SetSentence(normalized);
  PopulateNodes(&lattice);

  NBestEncodeResult nbest_results;
  for (const auto &nbest : lattice.NBest(nbest_size, false, 0.0)) {
    EncodeResult results;
    for (const auto *node : nbest.first) {
      results.emplace_back(node->piece, node->id);
    }
    nbest_results.emplace_back(results, nbest.second);
  }

  return nbest_results;
}